

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDeclsCtx::addImplicitData
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *this,DataStringT *data)

{
  Module *module;
  __single_object _Var1;
  reference this_00;
  pointer pDVar2;
  Const *pCVar3;
  Ok local_71;
  string_view local_70;
  string_view local_60;
  uintptr_t local_50;
  Builder local_48 [3];
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> local_30;
  __single_object d;
  Memory *mem;
  DataStringT *data_local;
  ParseDeclsCtx *this_local;
  
  this_00 = std::
            vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ::back(&this->wasm->memories);
  d._M_t.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
  super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
  super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true>)
       std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator*(this_00);
  std::make_unique<wasm::DataSegment>();
  _Var1._M_t.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
  super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
  super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl =
       d._M_t.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t
       .super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
       super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
  pDVar2 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                     (&local_30);
  wasm::Name::operator=
            (&pDVar2->memory,
             (Name *)_Var1._M_t.
                     super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                     .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl);
  pDVar2 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                     (&local_30);
  pDVar2->isPassive = false;
  Builder::Builder(local_48,this->wasm);
  local_50 = *(uintptr_t *)
              ((long)d._M_t.
                     super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                     .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl + 0x50);
  pCVar3 = Builder::makeConstPtr(local_48,0,(Type)local_50);
  pDVar2 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                     (&local_30);
  pDVar2->offset = (Expression *)pCVar3;
  pDVar2 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                     (&local_30);
  std::vector<char,_std::allocator<char>_>::operator=(&pDVar2->data,data);
  module = this->wasm;
  wasm::Name::Name((Name *)&local_70,"implicit-data");
  local_60 = (string_view)Names::getValidDataSegmentName(module,(Name)local_70);
  pDVar2 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                     (&local_30);
  wasm::Name::operator=((Name *)pDVar2,(Name *)&local_60);
  Module::addDataSegment(this->wasm,&local_30);
  Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_71);
  std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::~unique_ptr
            (&local_30);
  return __return_storage_ptr__;
}

Assistant:

Result<> ParseDeclsCtx::addImplicitData(DataStringT&& data) {
  auto& mem = *wasm.memories.back();
  auto d = std::make_unique<DataSegment>();
  d->memory = mem.name;
  d->isPassive = false;
  d->offset = Builder(wasm).makeConstPtr(0, mem.addressType);
  d->data = std::move(data);
  d->name = Names::getValidDataSegmentName(wasm, "implicit-data");
  wasm.addDataSegment(std::move(d));
  return Ok{};
}